

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O3

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int *piVar1;
  byte bVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  jpeg_entropy_decoder *pjVar6;
  JBLOCKROW paJVar7;
  jpeg_source_mgr *pjVar8;
  jpeg_error_mgr *pjVar9;
  uint uVar10;
  boolean bVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint nbits;
  int iVar15;
  _func_void_j_decompress_ptr *get_buffer;
  int iVar16;
  long lVar17;
  undefined4 uVar18;
  uint uVar19;
  bitread_working_state br_state;
  int newnz_pos [64];
  uint local_19c;
  int local_18c;
  uint local_184;
  bitread_working_state local_180;
  int local_154;
  j_decompress_ptr local_150;
  d_derived_tbl *local_148;
  jpeg_entropy_decoder *local_140;
  int aiStack_138 [66];
  
  bVar2 = (byte)cinfo->Al;
  uVar14 = 1 << (bVar2 & 0x1f);
  uVar10 = -1 << (bVar2 & 0x1f);
  pjVar6 = cinfo->entropy;
  iVar4 = cinfo->Se;
  if (((cinfo->restart_interval == 0) || (*(int *)((long)&pjVar6[2].decode_mcu + 4) != 0)) ||
     (bVar11 = process_restart(cinfo), bVar11 != 0)) {
    local_140 = pjVar6;
    if (pjVar6->insufficient_data == 0) {
      local_180.next_input_byte = cinfo->src->next_input_byte;
      local_180.bytes_in_buffer = cinfo->src->bytes_in_buffer;
      get_buffer = pjVar6[1].start_pass;
      uVar13 = (ulong)*(uint *)&pjVar6[1].decode_mcu;
      iVar15 = pjVar6[1].insufficient_data;
      paJVar7 = *MCU_data;
      iVar16 = cinfo->Ss;
      local_18c = 0;
      local_180.cinfo = cinfo;
      local_150 = cinfo;
      if (iVar4 < iVar16 || iVar15 != 0) {
        local_19c = 0;
LAB_00128549:
        uVar18 = (undefined4)uVar13;
        if (iVar15 != 0) {
LAB_00128551:
          uVar18 = (undefined4)uVar13;
          if (iVar16 <= iVar4) {
            lVar17 = 0;
            do {
              uVar19 = (uint)uVar13;
              iVar5 = jpeg_natural_order[iVar16 + lVar17];
              if ((*paJVar7)[iVar5] != 0) {
                if (((int)uVar19 < 1) &&
                   (bVar11 = jpeg_fill_bit_buffer(&local_180,(bit_buf_type)get_buffer,uVar19,1),
                   get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer,
                   uVar19 = local_180.bits_left, bVar11 == 0)) {
LAB_001288cb:
                  if ((int)local_19c < 1) {
                    return 0;
                  }
                  uVar13 = (ulong)local_19c + 1;
                  do {
                    (*paJVar7)[aiStack_138[uVar13 - 2]] = 0;
                    uVar13 = uVar13 - 1;
                  } while (1 < uVar13);
                  return 0;
                }
                uVar13 = (ulong)(uVar19 - 1);
                if ((((ulong)get_buffer >> (uVar13 & 0x3f) & 1) != 0) &&
                   (sVar3 = (*paJVar7)[iVar5], (uVar14 & (int)sVar3) == 0)) {
                  uVar19 = uVar14;
                  if (sVar3 < 0) {
                    uVar19 = uVar10;
                  }
                  (*paJVar7)[iVar5] = (short)uVar19 + sVar3;
                }
              }
              uVar18 = (undefined4)uVar13;
              lVar17 = lVar17 + 1;
            } while ((iVar4 - iVar16) + 1 != (int)lVar17);
          }
          local_18c = iVar15 + -1;
        }
      }
      else {
        local_148 = (d_derived_tbl *)pjVar6[4].start_pass;
        local_19c = 0;
        do {
          uVar19 = (uint)uVar13;
          if ((int)uVar19 < 8) {
            bVar11 = jpeg_fill_bit_buffer(&local_180,(bit_buf_type)get_buffer,uVar19,0);
            if (bVar11 == 0) goto LAB_001288cb;
            iVar15 = 1;
            get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer;
            uVar19 = local_180.bits_left;
            if (7 < local_180.bits_left) goto LAB_00128687;
LAB_001286b5:
            uVar12 = jpeg_huff_decode(&local_180,(bit_buf_type)get_buffer,uVar19,local_148,iVar15);
            get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer;
            uVar19 = local_180.bits_left;
            if ((int)uVar12 < 0) goto LAB_001288cb;
          }
          else {
LAB_00128687:
            iVar15 = local_148->lookup[(ulong)get_buffer >> ((char)uVar19 - 8U & 0x3f) & 0xff] >> 8;
            if (8 < iVar15) goto LAB_001286b5;
            uVar12 = local_148->lookup[(ulong)get_buffer >> ((char)uVar19 - 8U & 0x3f) & 0xff] &
                     0xff;
            uVar19 = uVar19 - iVar15;
          }
          uVar13 = (ulong)uVar19;
          nbits = uVar12 >> 4;
          if ((uVar12 & 0xf) == 0) {
            if (nbits != 0xf) {
              iVar15 = 1 << ((byte)nbits & 0x1f);
              if (uVar12 < 0x10) goto LAB_00128551;
              if (((int)uVar19 < (int)nbits) &&
                 (bVar11 = jpeg_fill_bit_buffer(&local_180,(bit_buf_type)get_buffer,uVar19,nbits),
                 get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer,
                 uVar19 = local_180.bits_left, bVar11 == 0)) goto LAB_001288cb;
              uVar13 = (ulong)(uVar19 - nbits);
              iVar15 = (iVar15 - 1U & (uint)((ulong)get_buffer >> ((byte)(uVar19 - nbits) & 0x3f)))
                       + iVar15;
              goto LAB_00128549;
            }
            local_184 = 0;
          }
          else {
            if ((uVar12 & 0xf) != 1) {
              pjVar9 = local_150->err;
              pjVar9->msg_code = 0x76;
              (*pjVar9->emit_message)((j_common_ptr)local_150,-1);
            }
            if (((int)uVar19 < 1) &&
               (bVar11 = jpeg_fill_bit_buffer(&local_180,(bit_buf_type)get_buffer,uVar19,1),
               get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer,
               uVar19 = local_180.bits_left, bVar11 == 0)) goto LAB_001288cb;
            uVar13 = (ulong)(uVar19 - 1);
            local_184 = uVar14;
            if (((ulong)get_buffer >> (uVar13 & 0x3f) & 1) == 0) {
              local_184 = uVar10;
            }
          }
          local_154 = iVar4;
          if (iVar4 < iVar16) {
            local_154 = iVar16;
          }
          local_154 = local_154 + 1;
          lVar17 = (long)iVar16 + -1;
          do {
            uVar19 = (uint)uVar13;
            iVar15 = jpeg_natural_order[lVar17 + 1];
            if ((*paJVar7)[iVar15] == 0) {
              iVar15 = iVar16;
              if ((int)nbits < 1) break;
              nbits = nbits - 1;
            }
            else {
              if (((int)uVar19 < 1) &&
                 (bVar11 = jpeg_fill_bit_buffer(&local_180,(bit_buf_type)get_buffer,uVar19,1),
                 get_buffer = (_func_void_j_decompress_ptr *)local_180.get_buffer,
                 uVar19 = local_180.bits_left, bVar11 == 0)) goto LAB_001288cb;
              uVar13 = (ulong)(uVar19 - 1);
              if ((((ulong)get_buffer >> (uVar13 & 0x3f) & 1) != 0) &&
                 (sVar3 = (*paJVar7)[iVar15], (uVar14 & (int)sVar3) == 0)) {
                uVar19 = uVar14;
                if (sVar3 < 0) {
                  uVar19 = uVar10;
                }
                (*paJVar7)[iVar15] = (short)uVar19 + sVar3;
              }
            }
            iVar16 = iVar16 + 1;
            lVar17 = lVar17 + 1;
            iVar15 = local_154;
          } while (lVar17 < iVar4);
          uVar18 = (undefined4)uVar13;
          if (local_184 != 0) {
            iVar16 = jpeg_natural_order[iVar15];
            (*paJVar7)[iVar16] = (JCOEF)local_184;
            lVar17 = (long)(int)local_19c;
            local_19c = local_19c + 1;
            aiStack_138[lVar17] = iVar16;
          }
          iVar16 = iVar15 + 1;
        } while (iVar15 < iVar4);
        local_18c = 0;
      }
      pjVar8 = local_150->src;
      pjVar8->next_input_byte = local_180.next_input_byte;
      pjVar8->bytes_in_buffer = local_180.bytes_in_buffer;
      local_140[1].start_pass = get_buffer;
      *(undefined4 *)&local_140[1].decode_mcu = uVar18;
      local_140[1].insufficient_data = local_18c;
      cinfo = local_150;
    }
    bVar11 = 1;
    if (cinfo->restart_interval != 0) {
      piVar1 = (int *)((long)&local_140[2].decode_mcu + 4);
      *piVar1 = *piVar1 + -1;
    }
  }
  else {
    bVar11 = 0;
  }
  return bVar11;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  unsigned char *st;
  int tbl, k, kex;
  int p1, m1;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;   /* if error do nothing */

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  p1 = 1 << cinfo->Al;          /* 1 in the bit position being coded */
  m1 = (NEG_1) << cinfo->Al;    /* -1 in the bit position being coded */

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = cinfo->Se; kex > 0; kex--)
    if ((*block)[jpeg_natural_order[kex]]) break;

  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      if (arith_decode(cinfo, st)) break;       /* EOB flag */
    for (;;) {
      thiscoef = *block + jpeg_natural_order[k];
      if (*thiscoef) {                          /* previously nonzero coef */
        if (arith_decode(cinfo, st + 2)) {
          if (*thiscoef < 0)
            *thiscoef += m1;
          else
            *thiscoef += p1;
        }
        break;
      }
      if (arith_decode(cinfo, st + 1)) {        /* newly nonzero coef */
        if (arith_decode(cinfo, entropy->fixed_bin))
          *thiscoef = m1;
        else
          *thiscoef = p1;
        break;
      }
      st += 3;  k++;
      if (k > cinfo->Se) {
        WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
        entropy->ct = -1;                       /* spectral overflow */
        return TRUE;
      }
    }
  }

  return TRUE;
}